

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

bool __thiscall
libtorrent::torrent_info::parse_piece_layers(torrent_info *this,bdecode_node *e,error_code *ec)

{
  ulong uVar1;
  type_t tVar2;
  int iVar3;
  uint uVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  int64_t iVar6;
  iterator iVar7;
  iterator iVar8;
  size_t sVar9;
  file_index_t i;
  file_index_t fVar10;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> this_00;
  bool bVar15;
  string_view local_130;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> f;
  set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  all_file_roots;
  map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  piece_layers;
  digest32<256L> local_70;
  sha256_hash root;
  
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &piece_layers._M_t._M_impl.super__Rb_tree_header._M_header;
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       piece_layers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tVar2 = bdecode_node::type(e);
  if (tVar2 != dict_t) {
    boost::system::error_code::operator=(ec,torrent_missing_piece_layer);
    bVar15 = false;
    goto LAB_0031d078;
  }
  all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header;
  all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00._M_head_impl =
       (this->m_orig_files).m_ptr._M_t.
       super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
       .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl;
  if ((torrent_info *)this_00._M_head_impl == (torrent_info *)0x0) {
    this_00._M_head_impl = &this->m_files;
  }
  all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       all_file_roots._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = file_storage::file_range(this_00._M_head_impl);
  iVar11 = iVar5;
  while (fVar10.m_val = (int)iVar11._begin.m_val, iVar5._end.m_val.m_val != fVar10.m_val) {
    iVar6 = file_storage::file_size(this_00._M_head_impl,fVar10);
    if (((file_storage *)&(this_00._M_head_impl)->m_piece_length)->m_piece_length < iVar6) {
      file_storage::root((sha256_hash *)&f,this_00._M_head_impl,fVar10);
      ::std::
      _Rb_tree<libtorrent::digest32<256l>,libtorrent::digest32<256l>,std::_Identity<libtorrent::digest32<256l>>,std::less<libtorrent::digest32<256l>>,std::allocator<libtorrent::digest32<256l>>>
      ::_M_insert_unique<libtorrent::digest32<256l>>
                ((_Rb_tree<libtorrent::digest32<256l>,libtorrent::digest32<256l>,std::_Identity<libtorrent::digest32<256l>>,std::less<libtorrent::digest32<256l>>,std::allocator<libtorrent::digest32<256l>>>
                  *)&all_file_roots,(digest32<256L> *)&f);
    }
    iVar11._begin.m_val = fVar10.m_val + 1;
    iVar11._end.m_val = 0;
  }
  iVar13 = 0;
  do {
    iVar3 = bdecode_node::dict_size(e);
    if (iVar3 <= iVar13) {
      iVar13 = file_storage::num_files(this_00._M_head_impl);
      aux::
      container_wrapper<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>>
      ::resize<int,void>((container_wrapper<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>>
                          *)&this->m_piece_layers,iVar13);
      iVar5 = file_storage::file_range(this_00._M_head_impl);
      lVar14 = ((long)iVar5 >> 0x20) - (long)iVar5._begin.m_val.m_val;
      lVar12 = (long)iVar5._begin.m_val.m_val * 0x18;
      goto LAB_0031d0dd;
    }
    bdecode_node::dict_at(&f,e,iVar13);
    if (((f.first._M_len != 0x20) || (tVar2 = bdecode_node::type(&f.second), tVar2 != string_t)) ||
       (uVar4 = bdecode_node::string_length(&f.second), (uVar4 & 0x1f) != 0)) {
      boost::system::error_code::operator=(ec,torrent_invalid_piece_layer);
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&f.second);
      break;
    }
    sVar9 = f.first._M_len;
    if (0x1f < (long)f.first._M_len) {
      sVar9 = 0x20;
    }
    memcpy(&root,f.first._M_str,sVar9);
    iVar7 = ::std::
            _Rb_tree<libtorrent::digest32<256L>,_libtorrent::digest32<256L>,_std::_Identity<libtorrent::digest32<256L>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::find(&all_file_roots._M_t,&root);
    if ((_Rb_tree_header *)iVar7._M_node == &all_file_roots._M_t._M_impl.super__Rb_tree_header) {
      boost::system::error_code::operator=(ec,torrent_invalid_piece_layer);
    }
    else {
      sVar9 = f.first._M_len;
      if (0x1f < (long)f.first._M_len) {
        sVar9 = 0x20;
      }
      memcpy(&local_70,f.first._M_str,sVar9);
      local_130 = bdecode_node::string_value(&f.second);
      ::std::
      _Rb_tree<libtorrent::digest32<256l>,std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>,std::_Select1st<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
      ::
      _M_emplace_unique<libtorrent::digest32<256l>,std::basic_string_view<char,std::char_traits<char>>>
                ((_Rb_tree<libtorrent::digest32<256l>,std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>,std::_Select1st<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
                  *)&piece_layers,&local_70,&local_130);
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&f.second);
    iVar13 = iVar13 + 1;
  } while ((_Rb_tree_header *)iVar7._M_node != &all_file_roots._M_t._M_impl.super__Rb_tree_header);
LAB_0031d06c:
  bVar15 = false;
  goto LAB_0031d06e;
LAB_0031d0dd:
  bVar15 = lVar14 == 0;
  lVar14 = lVar14 + -1;
  if (bVar15) goto LAB_0031d16a;
  fVar10.m_val = (int)iVar5._begin.m_val;
  iVar6 = file_storage::file_size(this_00._M_head_impl,fVar10);
  if (((file_storage *)&(this_00._M_head_impl)->m_piece_length)->m_piece_length < iVar6) {
    file_storage::root((sha256_hash *)&f,this_00._M_head_impl,fVar10);
    iVar8 = ::std::
            _Rb_tree<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::find(&piece_layers._M_t,(key_type *)&f);
    if ((_Rb_tree_header *)iVar8._M_node != &piece_layers._M_t._M_impl.super__Rb_tree_header) {
      iVar13 = file_storage::file_num_pieces(this_00._M_head_impl,fVar10);
      uVar1 = *(ulong *)(iVar8._M_node + 2);
      if ((uVar1 != (long)iVar13 * 0x20) || ((uVar1 & 0x1f) != 0)) {
        boost::system::error_code::operator=(ec,torrent_invalid_piece_layer);
        goto LAB_0031d06c;
      }
      ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
                ((vector<char,std::allocator<char>> *)
                 ((long)&((this->m_piece_layers).
                          super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                          .
                          super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<char,_std::allocator<char>_> + lVar12),
                 iVar8._M_node[2]._M_parent,(long)&(iVar8._M_node[2]._M_parent)->_M_color + uVar1);
    }
  }
  lVar12 = lVar12 + 0x18;
  iVar5._begin.m_val = fVar10.m_val + 1;
  iVar5._end.m_val = 0;
  goto LAB_0031d0dd;
LAB_0031d16a:
  (this->m_flags).m_val = (this->m_flags).m_val | 0x10;
  bVar15 = true;
LAB_0031d06e:
  ::std::
  _Rb_tree<libtorrent::digest32<256L>,_libtorrent::digest32<256L>,_std::_Identity<libtorrent::digest32<256L>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  ::~_Rb_tree(&all_file_roots._M_t);
LAB_0031d078:
  ::std::
  _Rb_tree<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Rb_tree(&piece_layers._M_t);
  return bVar15;
}

Assistant:

bool torrent_info::parse_piece_layers(bdecode_node const& e, error_code& ec)
	{
		std::map<sha256_hash, string_view> piece_layers;

		if (e.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_missing_piece_layer;
			return false;
		}

		std::set<sha256_hash> all_file_roots;
		auto const& fs = orig_files();
		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;
			all_file_roots.insert(fs.root(i));
		}

		for (int i = 0; i < e.dict_size(); ++i)
		{
			auto const f = e.dict_at(i);
			if (f.first.size() != static_cast<std::size_t>(sha256_hash::size())
				|| f.second.type() != bdecode_node::string_t
				|| f.second.string_length() % sha256_hash::size() != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			sha256_hash const root(f.first);
			if (all_file_roots.find(root) == all_file_roots.end())
			{
				// This piece layer doesn't refer to any file in this torrent
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			piece_layers.emplace(sha256_hash(f.first), f.second.string_value());
		}

		m_piece_layers.resize(fs.num_files());

		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;

			auto const piece_layer = piece_layers.find(fs.root(i));
			if (piece_layer == piece_layers.end()) continue;

			int const num_pieces = fs.file_num_pieces(i);

			if (ptrdiff_t(piece_layer->second.size()) != num_pieces * sha256_hash::size())
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			auto const hashes = piece_layer->second;
			if ((hashes.size() % sha256_hash::size()) != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			m_piece_layers[i].assign(hashes.begin(), hashes.end());
		}

		m_flags |= v2_has_piece_hashes;
		return true;
	}